

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateDescriptorDeclarations
          (MessageGenerator *this,Printer *printer)

{
  scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator> *this_00;
  MessageGenerator *this_01;
  Descriptor *pDVar1;
  int i;
  long lVar2;
  long lVar3;
  string local_50;
  
  io::Printer::Print(printer,
                     "const ::google::protobuf::Descriptor* $name$_descriptor_ = NULL;\nconst ::google::protobuf::internal::GeneratedMessageReflection*\n  $name$_reflection_ = NULL;\n"
                     ,"name",&this->classname_);
  for (lVar2 = 0; pDVar1 = this->descriptor_, lVar2 < *(int *)(pDVar1 + 0x38); lVar2 = lVar2 + 1) {
    this_00 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>_>
              ::operator[](&this->nested_generators_,lVar2);
    this_01 = internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>::operator->
                        (this_00);
    GenerateDescriptorDeclarations(this_01,printer);
  }
  lVar2 = 0;
  for (lVar3 = 0; lVar3 < *(int *)(pDVar1 + 0x48); lVar3 = lVar3 + 1) {
    ClassName_abi_cxx11_
              (&local_50,(cpp *)(*(long *)(pDVar1 + 0x50) + lVar2),(EnumDescriptor *)0x0,
               SUB41(*(int *)(pDVar1 + 0x48),0));
    io::Printer::Print(printer,
                       "const ::google::protobuf::EnumDescriptor* $name$_descriptor_ = NULL;\n",
                       "name",&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    pDVar1 = this->descriptor_;
    lVar2 = lVar2 + 0x38;
  }
  return;
}

Assistant:

void MessageGenerator::
GenerateDescriptorDeclarations(io::Printer* printer) {
  printer->Print(
    "const ::google::protobuf::Descriptor* $name$_descriptor_ = NULL;\n"
    "const ::google::protobuf::internal::GeneratedMessageReflection*\n"
    "  $name$_reflection_ = NULL;\n",
    "name", classname_);

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    nested_generators_[i]->GenerateDescriptorDeclarations(printer);
  }

  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    printer->Print(
      "const ::google::protobuf::EnumDescriptor* $name$_descriptor_ = NULL;\n",
      "name", ClassName(descriptor_->enum_type(i), false));
  }
}